

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::ChannelsSplit(ImDrawList *this,int channels_count)

{
  int iVar1;
  ImDrawChannel *pIVar2;
  undefined8 *puVar3;
  int in_ESI;
  ImDrawChannel *in_RDI;
  ImDrawCmd draw_cmd;
  int i;
  int old_channels_count;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  ImDrawCmd *in_stack_ffffffffffffff90;
  int local_14;
  
  iVar1 = *(int *)&in_RDI[4].IdxBuffer.Data;
  if (iVar1 < in_ESI) {
    ImVector<ImDrawChannel>::resize
              ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  }
  in_RDI[4].IdxBuffer.Capacity = in_ESI;
  pIVar2 = ImVector<ImDrawChannel>::operator[]
                     ((ImVector<ImDrawChannel> *)&in_RDI[4].IdxBuffer.Data,0);
  memset(pIVar2,0,0x20);
  for (local_14 = 1; local_14 < in_ESI; local_14 = local_14 + 1) {
    if (local_14 < iVar1) {
      ImVector<ImDrawChannel>::operator[]
                ((ImVector<ImDrawChannel> *)&in_RDI[4].IdxBuffer.Data,local_14);
      ImVector<ImDrawCmd>::resize
                ((ImVector<ImDrawCmd> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      ImVector<ImDrawChannel>::operator[]
                ((ImVector<ImDrawChannel> *)&in_RDI[4].IdxBuffer.Data,local_14);
      ImVector<unsigned_short>::resize
                ((ImVector<unsigned_short> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    }
    else {
      in_stack_ffffffffffffff90 =
           (ImDrawCmd *)
           ImVector<ImDrawChannel>::operator[]
                     ((ImVector<ImDrawChannel> *)&in_RDI[4].IdxBuffer.Data,local_14);
      puVar3 = (undefined8 *)operator_new(0x20);
      puVar3[2] = 0;
      puVar3[3] = 0;
      *puVar3 = 0;
      puVar3[1] = 0;
      ImDrawChannel::ImDrawChannel(in_RDI);
    }
    pIVar2 = ImVector<ImDrawChannel>::operator[]
                       ((ImVector<ImDrawChannel> *)&in_RDI[4].IdxBuffer.Data,local_14);
    if ((pIVar2->CmdBuffer).Size == 0) {
      ImDrawCmd::ImDrawCmd(in_stack_ffffffffffffff90);
      ImVector<ImVec4>::back((ImVector<ImVec4> *)(in_RDI + 3));
      ImVector<void_*>::back((ImVector<void_*> *)&in_RDI[3].IdxBuffer);
      ImVector<ImDrawChannel>::operator[]
                ((ImVector<ImDrawChannel> *)&in_RDI[4].IdxBuffer.Data,local_14);
      ImVector<ImDrawCmd>::push_back
                ((ImVector<ImDrawCmd> *)in_stack_ffffffffffffff90,
                 (ImDrawCmd *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
  }
  return;
}

Assistant:

void ImDrawList::ChannelsSplit(int channels_count)
{
    IM_ASSERT(_ChannelsCurrent == 0 && _ChannelsCount == 1);
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _ChannelsCount = channels_count;

    // _Channels[] (24/32 bytes each) hold storage that we'll swap with this->_CmdBuffer/_IdxBuffer
    // The content of _Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy _CmdBuffer/_IdxBuffer into _Channels[0] and then _Channels[1] into _CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i].CmdBuffer.resize(0);
            _Channels[i].IdxBuffer.resize(0);
        }
        if (_Channels[i].CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = _ClipRectStack.back();
            draw_cmd.TextureId = _TextureIdStack.back();
            _Channels[i].CmdBuffer.push_back(draw_cmd);
        }
    }
}